

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O2

Value * __thiscall
camp::Property::get(Value *__return_storage_ptr__,Property *this,UserObject *object)

{
  bool bVar1;
  ForbiddenRead *__return_storage_ptr___00;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  ForbiddenRead local_68;
  
  bVar1 = readable(this,object);
  if (bVar1) {
    (*(this->super_TagHolder)._vptr_TagHolder[3])(__return_storage_ptr__,this,object);
    return __return_storage_ptr__;
  }
  __return_storage_ptr___00 = (ForbiddenRead *)__cxa_allocate_exception(0x48);
  ForbiddenRead::ForbiddenRead(&local_68,&this->m_name);
  std::__cxx11::string::string
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/property.cpp"
             ,&local_a9);
  std::__cxx11::string::string
            ((string *)&local_a8,"Value camp::Property::get(const UserObject &) const",&local_aa);
  Error::prepare<camp::ForbiddenRead>(__return_storage_ptr___00,&local_68,&local_88,0x49,&local_a8);
  __cxa_throw(__return_storage_ptr___00,&ForbiddenRead::typeinfo,Error::~Error);
}

Assistant:

Value Property::get(const UserObject& object) const
{
    // Check if the property is readable
    if (!readable(object))
        CAMP_ERROR(ForbiddenRead(name()));

    return getValue(object);
}